

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O1

void __thiscall
QOpenGL2PaintEngineExPrivate::transferMode(QOpenGL2PaintEngineExPrivate *this,EngineMode newMode)

{
  QOpenGLEngineShaderManager *pQVar1;
  QOpenGLPoint *pQVar2;
  float *data;
  qsizetype qVar3;
  socklen_t in_ECX;
  socklen_t sVar4;
  sockaddr *in_RDX;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  int iVar5;
  EngineMode __fd;
  
  if (this->mode == newMode) {
    return;
  }
  pQVar1 = this->shaderManager;
  pQVar1->complexGeometry = newMode == TextDrawingMode;
  pQVar1->shaderProgNeedsChanging = true;
  __fd = newMode;
  if (newMode == ImageDrawingMode) {
    QOpenGLBuffer::bind(&this->vertexBuffer,0,in_RDX,in_ECX);
    QOpenGLBuffer::allocate(&this->vertexBuffer,this->staticVertexCoordinateArray,0x20);
    iVar5 = 2;
    sVar4 = 0;
    (**(code **)(*(long *)&this->funcs + 0x468))(0,2,0x1406,0,0,0);
    QOpenGLBuffer::bind(&this->texCoordBuffer,iVar5,__addr,sVar4);
    QOpenGLBuffer::allocate(&this->texCoordBuffer,this->staticTextureCoordinateArray,0x20);
    __fd = BrushDrawingMode;
    in_ECX = 0;
    (**(code **)(*(long *)&this->funcs + 0x468))(1,2,0x1406,0,0,0);
    in_RDX = extraout_RDX;
  }
  if (newMode - ImageArrayDrawingMode < 2) {
    pQVar2 = (this->vertexCoordinateArray).vertexArray.buffer;
    qVar3 = (this->vertexCoordinateArray).vertexArray.siz;
    QOpenGLBuffer::bind(&this->vertexBuffer,__fd,in_RDX,in_ECX);
    QOpenGLBuffer::allocate(&this->vertexBuffer,pQVar2,(int)qVar3 << 3);
    iVar5 = 2;
    sVar4 = 0;
    (**(code **)(*(long *)&this->funcs + 0x468))(0,2,0x1406,0,0,0);
    pQVar2 = (this->textureCoordinateArray).vertexArray.buffer;
    qVar3 = (this->textureCoordinateArray).vertexArray.siz;
    QOpenGLBuffer::bind(&this->texCoordBuffer,iVar5,__addr_00,sVar4);
    QOpenGLBuffer::allocate(&this->texCoordBuffer,pQVar2,(int)qVar3 << 3);
    iVar5 = 2;
    sVar4 = 0;
    (**(code **)(*(long *)&this->funcs + 0x468))(1,2,0x1406,0,0,0);
    if (newMode == TextDrawingMode) goto LAB_00143155;
    if (newMode == ImageOpacityArrayDrawingMode) {
      data = (this->opacityArray).buffer;
      qVar3 = (this->opacityArray).siz;
      QOpenGLBuffer::bind(&this->opacityBuffer,iVar5,__addr_01,sVar4);
      QOpenGLBuffer::allocate(&this->opacityBuffer,data,(int)qVar3 << 2);
      (**(code **)(*(long *)&this->funcs + 0x468))(2,1,0x1406,0,0,0);
      goto LAB_00143142;
    }
  }
  else {
LAB_00143142:
    if (newMode == TextDrawingMode) goto LAB_00143155;
  }
  QOpenGLEngineShaderManager::setMaskType((QOpenGLEngineShaderManager *)this->shaderManager,NoMask);
LAB_00143155:
  this->mode = newMode;
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::transferMode(EngineMode newMode)
{
    if (newMode == mode)
        return;

    if (newMode == TextDrawingMode) {
        shaderManager->setHasComplexGeometry(true);
    } else {
        shaderManager->setHasComplexGeometry(false);
    }

    if (newMode == ImageDrawingMode) {
        uploadData(QT_VERTEX_COORDS_ATTR, staticVertexCoordinateArray, 8);
        uploadData(QT_TEXTURE_COORDS_ATTR, staticTextureCoordinateArray, 8);
    }

    if (newMode == ImageArrayDrawingMode || newMode == ImageOpacityArrayDrawingMode) {
        uploadData(QT_VERTEX_COORDS_ATTR, (GLfloat*)vertexCoordinateArray.data(), vertexCoordinateArray.vertexCount() * 2);
        uploadData(QT_TEXTURE_COORDS_ATTR, (GLfloat*)textureCoordinateArray.data(), textureCoordinateArray.vertexCount() * 2);

        if (newMode == ImageOpacityArrayDrawingMode)
            uploadData(QT_OPACITY_ATTR, (GLfloat*)opacityArray.data(), opacityArray.size());
    }

    // This needs to change when we implement high-quality anti-aliasing...
    if (newMode != TextDrawingMode)
        shaderManager->setMaskType(QOpenGLEngineShaderManager::NoMask);

    mode = newMode;
}